

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transition.hpp
# Opt level: O2

bool __thiscall
peach::transition::
MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<'a',_'z'>,_peach::transition::RangeCharTransitionTemplate<'A',_'Z'>_>,_peach::transition::SingleCharTransitionTemplate<'_'>_>,_peach::transition::RangeCharTransitionTemplate<'0',_'9'>_>
::isActive(MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>_>
           *this,char c)

{
  type_conflict tVar1;
  char local_9;
  char *local_8;
  
  local_8 = &local_9;
  local_9 = c;
  tVar1 = std::
          __apply_impl<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>::isActive(char)::_lambda(peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>&,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>&)_1_,std::tuple<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>&,0ul,1ul>
                    (&local_8,&this->subtransitions_);
  return tVar1;
}

Assistant:

bool isActive(char c) override
    {
        return std::apply(
            [&](TransitionClasses &... transitions) {
                return (... || transitions.isActive(c));
            },
            subtransitions_);
    }